

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# njd_node.c
# Opt level: O2

void NJDNode_copy(NJDNode *node1,NJDNode *node2)

{
  NJDNode_set_string(node1,node2->string);
  NJDNode_set_pos(node1,node2->pos);
  NJDNode_set_pos_group1(node1,node2->pos_group1);
  NJDNode_set_pos_group2(node1,node2->pos_group2);
  NJDNode_set_pos_group3(node1,node2->pos_group3);
  NJDNode_set_ctype(node1,node2->ctype);
  NJDNode_set_cform(node1,node2->cform);
  NJDNode_set_orig(node1,node2->orig);
  NJDNode_set_read(node1,node2->read);
  NJDNode_set_pron(node1,node2->pron);
  NJDNode_set_acc(node1,node2->acc);
  NJDNode_set_mora_size(node1,node2->mora_size);
  NJDNode_set_chain_rule(node1,node2->chain_rule);
  node1->chain_flag = node2->chain_flag;
  return;
}

Assistant:

void NJDNode_copy(NJDNode * node1, NJDNode * node2)
{
   NJDNode_set_string(node1, node2->string);
   NJDNode_set_pos(node1, node2->pos);
   NJDNode_set_pos_group1(node1, node2->pos_group1);
   NJDNode_set_pos_group2(node1, node2->pos_group2);
   NJDNode_set_pos_group3(node1, node2->pos_group3);
   NJDNode_set_ctype(node1, node2->ctype);
   NJDNode_set_cform(node1, node2->cform);
   NJDNode_set_orig(node1, node2->orig);
   NJDNode_set_read(node1, node2->read);
   NJDNode_set_pron(node1, node2->pron);
   NJDNode_set_acc(node1, node2->acc);
   NJDNode_set_mora_size(node1, node2->mora_size);
   NJDNode_set_chain_rule(node1, node2->chain_rule);
   NJDNode_set_chain_flag(node1, node2->chain_flag);
}